

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_3983::test_of_ptr(void **param_1)

{
  _Bool _Var1;
  long lVar2;
  roaring64_bitmap_t *r;
  uint64_t i;
  uint64_t uVar3;
  uint64_t uVar4;
  array<unsigned_long,_1000UL> vals;
  uint64_t local_1f60 [1000];
  
  uVar3 = 0;
  uVar4 = 1;
  lVar2 = 0;
  do {
    local_1f60[lVar2] = uVar3;
    local_1f60[lVar2 + 1] = uVar4;
    lVar2 = lVar2 + 2;
    uVar3 = uVar3 + 2;
    uVar4 = uVar4 + 2;
  } while (lVar2 != 1000);
  r = roaring64_bitmap_of_ptr(1000,local_1f60);
  assert_r64_valid((roaring64_bitmap_t *)r);
  lVar2 = 0;
  do {
    _Var1 = roaring64_bitmap_contains(r,local_1f60[lVar2]);
    _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, vals[i])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0x89);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 1000);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_of_ptr) {
    std::array<uint64_t, 1000> vals;
    std::iota(vals.begin(), vals.end(), 0);
    roaring64_bitmap_t* r = roaring64_bitmap_of_ptr(vals.size(), vals.data());
    assert_r64_valid(r);
    for (uint64_t i = 0; i < 1000; ++i) {
        assert_true(roaring64_bitmap_contains(r, vals[i]));
    }
    roaring64_bitmap_free(r);
}